

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall icu_63::number::impl::DecimalQuantity::compact(DecimalQuantity *this)

{
  char *pcVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  if (this->usingBytes == true) {
    uVar2 = this->precision;
    if ((int)uVar2 < 1) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        if ((this->fBCD).bcdBytes.ptr[uVar8] != '\0') goto LAB_0020fa95;
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
      uVar8 = (ulong)uVar2;
    }
LAB_0020fa95:
    if ((uint)uVar8 != uVar2) {
      shiftRight(this,(uint)uVar8);
      uVar2 = this->precision;
      uVar8 = (ulong)uVar2;
      uVar7 = uVar2 + 1;
      do {
        uVar5 = (int)uVar2 >> 0x1f & uVar2;
        if ((int)uVar8 < 1) break;
        uVar7 = uVar7 - 1;
        pcVar1 = (char *)(((this->fBCD).bcdLong - 1) + uVar8);
        uVar8 = uVar8 - 1;
        uVar5 = uVar7;
      } while (*pcVar1 == '\0');
      this->precision = uVar5;
      if (0x10 < (int)uVar5) {
        return;
      }
      switchStorage(this);
      return;
    }
  }
  else {
    uVar8 = (this->fBCD).bcdLong;
    if (uVar8 != 0) {
      uVar2 = this->precision;
      uVar6 = (ulong)uVar2;
      uVar9 = 0;
      if (0 < (int)uVar2) {
        do {
          if ((uVar9 < 0x10) && ((0xfL << ((char)uVar9 * '\x04' & 0x3fU) & uVar8) != 0))
          goto LAB_0020fa3a;
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar6);
        uVar9 = (ulong)uVar2;
      }
LAB_0020fa3a:
      uVar8 = uVar8 >> ((char)uVar9 * '\x04' & 0x3fU);
      (this->fBCD).bcdLong = uVar8;
      this->scale = this->scale + (int)uVar9;
      lVar10 = uVar6 * 4 + -4;
      uVar9 = uVar6 - 1;
      do {
        uVar5 = (uint)uVar6;
        uVar7 = (int)uVar2 >> 0x1f & uVar2;
        if ((int)uVar5 < 1) break;
        bVar3 = (byte)lVar10;
        uVar6 = (ulong)(uVar5 - 1);
        uVar11 = uVar9 - 1;
        lVar10 = lVar10 + -4;
        uVar4 = uVar9 & 0xfffffff0;
        uVar9 = uVar11;
      } while ((uVar4 != 0) || (uVar7 = uVar5, (0xfL << (bVar3 & 0x3f) & uVar8) == 0));
      this->precision = uVar7;
      return;
    }
  }
  setBcdToZero(this);
  return;
}

Assistant:

void DecimalQuantity::compact() {
    if (usingBytes) {
        int32_t delta = 0;
        for (; delta < precision && fBCD.bcdBytes.ptr[delta] == 0; delta++);
        if (delta == precision) {
            // Number is zero
            setBcdToZero();
            return;
        } else {
            // Remove trailing zeros
            shiftRight(delta);
        }

        // Compute precision
        int32_t leading = precision - 1;
        for (; leading >= 0 && fBCD.bcdBytes.ptr[leading] == 0; leading--);
        precision = leading + 1;

        // Switch storage mechanism if possible
        if (precision <= 16) {
            switchStorage();
        }

    } else {
        if (fBCD.bcdLong == 0L) {
            // Number is zero
            setBcdToZero();
            return;
        }

        // Compact the number (remove trailing zeros)
        // TODO: Use a more efficient algorithm here and below. There is a logarithmic one.
        int32_t delta = 0;
        for (; delta < precision && getDigitPos(delta) == 0; delta++);
        fBCD.bcdLong >>= delta * 4;
        scale += delta;

        // Compute precision
        int32_t leading = precision - 1;
        for (; leading >= 0 && getDigitPos(leading) == 0; leading--);
        precision = leading + 1;
    }
}